

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

string * __thiscall
testing::internal::CapturedStream::GetCapturedString_abi_cxx11_
          (string *__return_storage_ptr__,CapturedStream *this)

{
  FILE *__stream;
  ostream *poVar1;
  FILE *extraout_RDX;
  FILE *extraout_RDX_00;
  FILE *file;
  GTestLog local_1c;
  
  if (this->uncaptured_fd_ != -1) {
    fflush((FILE *)0x0);
    dup2(this->uncaptured_fd_,this->fd_);
    close(this->uncaptured_fd_);
    this->uncaptured_fd_ = -1;
  }
  __stream = fopen((this->filename_)._M_dataplus._M_p,"r");
  file = extraout_RDX;
  if (__stream == (FILE *)0x0) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/third_party/googletest/googletest/src/gtest-port.cc"
                       ,0x478);
    poVar1 = std::operator<<((ostream *)&std::cerr,"Failed to open tmp file ");
    poVar1 = std::operator<<(poVar1,(string *)&this->filename_);
    std::operator<<(poVar1," for capturing stream.");
    GTestLog::~GTestLog(&local_1c);
    file = extraout_RDX_00;
  }
  ReadEntireFile_abi_cxx11_(__return_storage_ptr__,(internal *)__stream,file);
  fclose(__stream);
  return __return_storage_ptr__;
}

Assistant:

std::string GetCapturedString() {
    if (uncaptured_fd_ != -1) {
      // Restores the original stream.
      fflush(nullptr);
      dup2(uncaptured_fd_, fd_);
      close(uncaptured_fd_);
      uncaptured_fd_ = -1;
    }

    FILE* const file = posix::FOpen(filename_.c_str(), "r");
    if (file == nullptr) {
      GTEST_LOG_(FATAL) << "Failed to open tmp file " << filename_
                        << " for capturing stream.";
    }
    const std::string content = ReadEntireFile(file);
    posix::FClose(file);
    return content;
  }